

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.h
# Opt level: O2

mz_bool mz_zip_writer_add_to_central_dir
                  (mz_zip_archive *pZip,char *pFilename,mz_uint16 filename_size,void *pExtra,
                  mz_uint16 extra_size,void *pComment,mz_uint16 comment_size,mz_uint64 uncomp_size,
                  mz_uint64 comp_size,mz_uint32 uncomp_crc32,mz_uint16 method,mz_uint16 bit_flags,
                  mz_uint16 dos_time,mz_uint16 dos_date,mz_uint64 param_15,mz_uint32 ext_attributes,
                  char *user_extra_data,mz_uint user_extra_data_len)

{
  mz_zip_internal_state *pArray;
  size_t sVar1;
  mz_bool mVar2;
  ulong uVar3;
  ulong uVar4;
  undefined6 in_register_00000012;
  ulong uVar5;
  mz_uint64 mVar6;
  byte bVar7;
  undefined4 local_a8;
  int local_a4;
  undefined1 uStack_a0;
  undefined1 uStack_9f;
  undefined1 uStack_9e;
  undefined1 uStack_9d;
  mz_uint16 mStack_9c;
  undefined1 uStack_9a;
  undefined1 uStack_99;
  undefined1 uStack_98;
  undefined1 uStack_97;
  undefined1 uStack_96;
  undefined1 uStack_95;
  undefined8 local_94;
  ulong uStack_8c;
  undefined2 local_84;
  undefined1 local_82;
  undefined1 local_81;
  undefined1 local_80;
  undefined1 local_7f;
  undefined1 local_7e;
  undefined1 local_7d;
  undefined1 local_7c;
  undefined1 local_7b;
  undefined4 local_70;
  mz_uint32 central_dir_ofs;
  ulong local_68;
  ulong local_60;
  ulong local_58;
  ulong local_50;
  void *local_48;
  void *local_40;
  char *local_38;
  
  pArray = pZip->m_pState;
  uVar5 = (pArray->m_central_dir).m_size;
  central_dir_ofs = (mz_uint32)uVar5;
  if ((param_15 >> 0x20 == 0) || (pArray->m_zip64 != 0)) {
    local_50 = (ulong)filename_size;
    local_58 = (ulong)extra_size;
    local_60 = (ulong)user_extra_data_len;
    local_68 = (ulong)comment_size;
    if (local_58 + local_50 + local_68 + local_60 + uVar5 + 0x2e < 0xffffffff) {
      local_84 = 0;
      bVar7 = 0x14;
      if (method == 0) {
        bVar7 = 0;
      }
      local_a8 = 0x2014b50;
      _local_a4 = CONCAT17((char)(method >> 8),
                           CONCAT16((char)method,
                                    CONCAT15((char)(bit_flags >> 8),
                                             CONCAT14((char)bit_flags,(uint)bVar7 << 0x10))));
      _mStack_9c = CONCAT17((char)(uncomp_crc32 >> 0x18),
                            CONCAT16((char)(uncomp_crc32 >> 0x10),
                                     CONCAT15((char)(uncomp_crc32 >> 8),
                                              CONCAT14((char)uncomp_crc32,
                                                       CONCAT13((char)(dos_date >> 8),
                                                                CONCAT12((char)dos_date,dos_time))))
                                    ));
      if (0xfffffffe < comp_size) {
        comp_size = 0xffffffff;
      }
      if (0xfffffffe < uncomp_size) {
        uncomp_size = 0xffffffff;
      }
      local_94 = CONCAT17((char)(uncomp_size >> 0x18),
                          CONCAT16((char)(uncomp_size >> 0x10),
                                   CONCAT15((char)(uncomp_size >> 8),
                                            CONCAT14((char)uncomp_size,(int)comp_size))));
      local_70 = (undefined4)CONCAT62(in_register_00000012,filename_size);
      uStack_8c = (ulong)CONCAT15((char)(comment_size >> 8),
                                  CONCAT14((char)comment_size,
                                           CONCAT13((char)(user_extra_data_len + extra_size >> 8),
                                                    CONCAT12((char)(user_extra_data_len + extra_size
                                                                   ),filename_size))));
      local_82 = (undefined1)ext_attributes;
      local_81 = (undefined1)(ext_attributes >> 8);
      local_80 = (undefined1)(ext_attributes >> 0x10);
      local_7f = (undefined1)(ext_attributes >> 0x18);
      mVar6 = 0xffffffff;
      if (param_15 < 0xffffffff) {
        mVar6 = param_15;
      }
      local_7e = (undefined1)mVar6;
      local_7d = (undefined1)(mVar6 >> 8);
      local_7c = (undefined1)(mVar6 >> 0x10);
      local_7b = (undefined1)(mVar6 >> 0x18);
      uVar3 = uVar5 + 0x2e;
      local_48 = pComment;
      local_40 = pExtra;
      local_38 = pFilename;
      if ((uVar3 <= (pArray->m_central_dir).m_capacity) ||
         (mVar2 = mz_zip_array_ensure_capacity(pZip,&pArray->m_central_dir,uVar3,1), mVar2 != 0)) {
        (pArray->m_central_dir).m_size = uVar3;
        uVar3 = (ulong)(pArray->m_central_dir).m_element_size;
        memcpy((void *)(uVar5 * uVar3 + (long)(pArray->m_central_dir).m_p),&local_a8,uVar3 * 0x2e);
        sVar1 = (pArray->m_central_dir).m_size;
        uVar3 = local_50 + sVar1;
        if ((uVar3 <= (pArray->m_central_dir).m_capacity) ||
           (mVar2 = mz_zip_array_ensure_capacity(pZip,&pArray->m_central_dir,uVar3,1), mVar2 != 0))
        {
          (pArray->m_central_dir).m_size = uVar3;
          if ((short)local_70 != 0) {
            uVar3 = (ulong)(pArray->m_central_dir).m_element_size;
            memcpy((void *)(sVar1 * uVar3 + (long)(pArray->m_central_dir).m_p),local_38,
                   local_50 * uVar3);
            uVar3 = (pArray->m_central_dir).m_size;
          }
          uVar4 = uVar3 + local_58;
          if ((uVar4 <= (pArray->m_central_dir).m_capacity) ||
             (mVar2 = mz_zip_array_ensure_capacity(pZip,&pArray->m_central_dir,uVar4,1), mVar2 != 0)
             ) {
            (pArray->m_central_dir).m_size = uVar4;
            if (extra_size != 0) {
              uVar4 = (ulong)(pArray->m_central_dir).m_element_size;
              memcpy((void *)(uVar3 * uVar4 + (long)(pArray->m_central_dir).m_p),local_40,
                     local_58 * uVar4);
              uVar4 = (pArray->m_central_dir).m_size;
            }
            uVar3 = local_60 + uVar4;
            if ((uVar3 <= (pArray->m_central_dir).m_capacity) ||
               (mVar2 = mz_zip_array_ensure_capacity(pZip,&pArray->m_central_dir,uVar3,1),
               mVar2 != 0)) {
              (pArray->m_central_dir).m_size = uVar3;
              if (user_extra_data_len != 0) {
                uVar3 = (ulong)(pArray->m_central_dir).m_element_size;
                memcpy((void *)(uVar4 * uVar3 + (long)(pArray->m_central_dir).m_p),user_extra_data,
                       local_60 * uVar3);
                uVar3 = (pArray->m_central_dir).m_size;
              }
              uVar4 = uVar3 + local_68;
              if ((uVar4 <= (pArray->m_central_dir).m_capacity) ||
                 (mVar2 = mz_zip_array_ensure_capacity(pZip,&pArray->m_central_dir,uVar4,1),
                 mVar2 != 0)) {
                (pArray->m_central_dir).m_size = uVar4;
                if (comment_size != 0) {
                  uVar4 = (ulong)(pArray->m_central_dir).m_element_size;
                  memcpy((void *)(uVar3 * uVar4 + (long)(pArray->m_central_dir).m_p),local_48,
                         local_68 * uVar4);
                }
                sVar1 = (pArray->m_central_dir_offsets).m_size;
                uVar3 = sVar1 + 1;
                if ((uVar3 <= (pArray->m_central_dir_offsets).m_capacity) ||
                   (mVar2 = mz_zip_array_ensure_capacity
                                      (pZip,&pArray->m_central_dir_offsets,uVar3,1), mVar2 != 0)) {
                  (pArray->m_central_dir_offsets).m_size = uVar3;
                  uVar5 = (ulong)(pArray->m_central_dir_offsets).m_element_size;
                  memcpy((void *)(sVar1 * uVar5 + (long)(pArray->m_central_dir_offsets).m_p),
                         &central_dir_ofs,uVar5);
                  return 1;
                }
              }
            }
          }
        }
      }
      if ((uVar5 <= (pArray->m_central_dir).m_capacity) ||
         (mVar2 = mz_zip_array_ensure_capacity(pZip,&pArray->m_central_dir,uVar5,0), mVar2 != 0)) {
        (pArray->m_central_dir).m_size = uVar5;
      }
      pZip->m_last_error = MZ_ZIP_ALLOC_FAILED;
    }
    else {
      pZip->m_last_error = MZ_ZIP_UNSUPPORTED_CDIR_SIZE;
    }
  }
  else {
    pZip->m_last_error = MZ_ZIP_FILE_TOO_LARGE;
  }
  return 0;
}

Assistant:

static mz_bool mz_zip_writer_add_to_central_dir(
    mz_zip_archive *pZip, const char *pFilename, mz_uint16 filename_size,
    const void *pExtra, mz_uint16 extra_size, const void *pComment,
    mz_uint16 comment_size, mz_uint64 uncomp_size, mz_uint64 comp_size,
    mz_uint32 uncomp_crc32, mz_uint16 method, mz_uint16 bit_flags,
    mz_uint16 dos_time, mz_uint16 dos_date, mz_uint64 local_header_ofs,
    mz_uint32 ext_attributes, const char *user_extra_data,
    mz_uint user_extra_data_len) {
  mz_zip_internal_state *pState = pZip->m_pState;
  mz_uint32 central_dir_ofs = (mz_uint32)pState->m_central_dir.m_size;
  size_t orig_central_dir_size = pState->m_central_dir.m_size;
  mz_uint8 central_dir_header[MZ_ZIP_CENTRAL_DIR_HEADER_SIZE];

  if (!pZip->m_pState->m_zip64) {
    if (local_header_ofs > 0xFFFFFFFF)
      return mz_zip_set_error(pZip, MZ_ZIP_FILE_TOO_LARGE);
  }

  /* miniz doesn't support central dirs >= MZ_UINT32_MAX bytes yet */
  if (((mz_uint64)pState->m_central_dir.m_size +
       MZ_ZIP_CENTRAL_DIR_HEADER_SIZE + filename_size + extra_size +
       user_extra_data_len + comment_size) >= MZ_UINT32_MAX)
    return mz_zip_set_error(pZip, MZ_ZIP_UNSUPPORTED_CDIR_SIZE);

  if (!mz_zip_writer_create_central_dir_header(
          pZip, central_dir_header, filename_size,
          (mz_uint16)(extra_size + user_extra_data_len), comment_size,
          uncomp_size, comp_size, uncomp_crc32, method, bit_flags, dos_time,
          dos_date, local_header_ofs, ext_attributes))
    return mz_zip_set_error(pZip, MZ_ZIP_INTERNAL_ERROR);

  if ((!mz_zip_array_push_back(pZip, &pState->m_central_dir, central_dir_header,
                               MZ_ZIP_CENTRAL_DIR_HEADER_SIZE)) ||
      (!mz_zip_array_push_back(pZip, &pState->m_central_dir, pFilename,
                               filename_size)) ||
      (!mz_zip_array_push_back(pZip, &pState->m_central_dir, pExtra,
                               extra_size)) ||
      (!mz_zip_array_push_back(pZip, &pState->m_central_dir, user_extra_data,
                               user_extra_data_len)) ||
      (!mz_zip_array_push_back(pZip, &pState->m_central_dir, pComment,
                               comment_size)) ||
      (!mz_zip_array_push_back(pZip, &pState->m_central_dir_offsets,
                               &central_dir_ofs, 1))) {
    /* Try to resize the central directory array back into its original state.
     */
    mz_zip_array_resize(pZip, &pState->m_central_dir, orig_central_dir_size,
                        MZ_FALSE);
    return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);
  }

  return MZ_TRUE;
}